

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O0

int segwit_addr_encode(char *output,char *hrp,uint8_t witver,uint8_t *witprog,size_t witprog_len)

{
  size_t local_90;
  size_t datalen;
  uint8_t data [65];
  size_t witprog_len_local;
  uint8_t *witprog_local;
  uint8_t witver_local;
  char *hrp_local;
  char *output_local;
  
  local_90 = 0;
  if (((witver < 0x11) && (((witver != '\0' || (witprog_len == 0x14)) || (witprog_len == 0x20)))) &&
     ((1 < witprog_len && (witprog_len < 0x29)))) {
    datalen._0_1_ = witver;
    convert_bits((uint8_t *)((long)&datalen + 1),&local_90,5,witprog,witprog_len,8,1);
    local_90 = local_90 + 1;
    output_local._4_4_ = bech32_encode(output,hrp,(uint8_t *)&datalen,local_90,0x5a,witver != '\0');
  }
  else {
    wally_clear_2(&datalen,0x41,witprog,witprog_len);
    output_local._4_4_ = 0;
  }
  return output_local._4_4_;
}

Assistant:

static int segwit_addr_encode(char *output, const char *hrp, uint8_t witver, const uint8_t *witprog, size_t witprog_len) {
    uint8_t data[65];
    size_t datalen = 0;
    if (witver > 16) goto fail;
    if (witver == 0 && witprog_len != 20 && witprog_len != 32) goto fail;
    if (witprog_len < 2 || witprog_len > 40) goto fail;
    data[0] = witver;
    convert_bits(data + 1, &datalen, 5, witprog, witprog_len, 8, 1);
    ++datalen;
    return bech32_encode(output, hrp, data, datalen, 90, (witver != 0));
fail:
    wally_clear_2(data, sizeof(data), (void *)witprog, witprog_len);
    return 0;
}